

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBarsH<float>
               (char *label_id,float *xs,float *ys,float *neg,float *pos,int count,int offset,
               int stride)

{
  undefined1 local_68 [8];
  GetterError<float> getter;
  int count_local;
  float *pos_local;
  float *neg_local;
  float *ys_local;
  float *xs_local;
  char *label_id_local;
  
  getter._44_4_ = count;
  GetterError<float>::GetterError((GetterError<float> *)local_68,xs,ys,neg,pos,count,offset,stride);
  PlotErrorBarsHEx<ImPlot::GetterError<float>>(label_id,(GetterError<float> *)local_68);
  return;
}

Assistant:

void PlotErrorBarsH(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsHEx(label_id, getter);
}